

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::checkNewInterface
          (CommonCore *this,LocalFederateId federateID,string_view key,InterfaceType type)

{
  BrokerState BVar1;
  bool bVar2;
  FederateStates FVar3;
  size_t sVar4;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  RegistrationFailure *pRVar5;
  BasicHandleInfo *pBVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  undefined7 in_register_00000081;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view sVar10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string local_88;
  char *local_68;
  size_t local_60;
  string local_58;
  
  sVar7 = key._M_len;
  iVar9 = (int)CONCAT71(in_register_00000081,type);
  sVar10 = interfaceTypeName(type);
  pcVar8 = sVar10._M_str;
  sVar4 = sVar10._M_len;
  if ((iVar9 == 0x74) || (iVar9 == 0x66)) {
    bVar2 = waitCoreRegistration(this);
    if (!bVar2) {
      BVar1 = (this->super_BrokerBase).brokerState._M_i;
      pRVar5 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      if (~CONNECTED < BVar1) {
        message_00._M_str = "core is terminated or in error state no further registration possible";
        message_00._M_len = 0x45;
        RegistrationFailure::RegistrationFailure(pRVar5,message_00);
        __cxa_throw(pRVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
      }
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x2d;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&local_58;
      local_58._M_dataplus._M_p = pcVar8;
      local_58._M_string_length = sVar4;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_88,(v11 *)"registration timeout exceeded for register {}",fmt_02,args_02);
      message_02._M_str = local_88._M_dataplus._M_p;
      message_02._M_len = local_88._M_string_length;
      RegistrationFailure::RegistrationFailure(pRVar5,message_02);
      __cxa_throw(pRVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
  }
  if (type == FILTER || federateID.fid == -0x103) {
    this_00 = (FederateState *)0x0;
  }
  else {
    this_00 = getFederateAt(this,federateID);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x22;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_58;
      local_58._M_dataplus._M_p = pcVar8;
      local_58._M_string_length = sVar4;
      ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"federateID not valid (register {})",fmt,args)
      ;
      sVar10._M_str = local_88._M_dataplus._M_p;
      sVar10._M_len = local_88._M_string_length;
      InvalidIdentifier::InvalidIdentifier(this_01,sVar10);
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
  }
  if ((type != INPUT) && ((this->super_BrokerBase).disableDynamicSources != false)) {
    if (this_00 == (FederateState *)0x0) {
      if (0xfffe < (this->super_BrokerBase).brokerState._M_i) {
        pRVar5 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
        sVar10 = interfaceTypeName(type);
        local_88._M_dataplus._M_p = sVar10._M_str;
        local_88._M_string_length = sVar10._M_len;
        fmt_03.size_ = 0xdd;
        fmt_03.data_ = (char *)0x3b;
        args_03.field_1.args_ = in_R9.args_;
        args_03.desc_ = (unsigned_long_long)&local_88;
        local_88.field_2._M_allocated_capacity = (size_type)key._M_str;
        local_88.field_2._8_8_ = sVar7;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_58,(v11 *)"Source {} not allowed after entering initializing mode ({})",
                   fmt_03,args_03);
        message_03._M_str = local_58._M_dataplus._M_p;
        message_03._M_len = local_58._M_string_length;
        RegistrationFailure::RegistrationFailure(pRVar5,message_03);
        __cxa_throw(pRVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
      }
    }
    else {
      FVar3 = FederateState::getState(this_00);
      if (FVar3 != CREATED) {
        bVar2 = FederateState::getOptionFlag(this_00,0);
        if (!bVar2) {
          pRVar5 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
          sVar10 = interfaceTypeName(type);
          local_88._M_dataplus._M_p = sVar10._M_str;
          local_88._M_string_length = sVar10._M_len;
          local_88.field_2._M_allocated_capacity = (size_type)(this_00->name)._M_dataplus._M_p;
          local_88.field_2._8_8_ = (this_00->name)._M_string_length;
          fmt_00.size_ = 0xddd;
          fmt_00.data_ = (char *)0x43;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&local_88;
          local_68 = key._M_str;
          local_60 = sVar7;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_58,
                     (v11 *)"Source {} from {} not allowed after entering initializing mode ({})",
                     fmt_00,args_00);
          message._M_str = local_58._M_dataplus._M_p;
          message._M_len = local_58._M_string_length;
          RegistrationFailure::RegistrationFailure(pRVar5,message);
          __cxa_throw(pRVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
        }
      }
    }
  }
  if (sVar7 != 0) {
    local_88._M_dataplus._M_p = (pointer)&(this->handles).m_mutex;
    local_88._M_string_length = CONCAT71(local_88._M_string_length._1_7_,1);
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)local_88._M_dataplus._M_p);
    pBVar6 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,key,type);
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&local_88);
    if (pBVar6 != (BasicHandleInfo *)0x0) {
      pRVar5 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x17;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_58;
      local_58._M_dataplus._M_p = pcVar8;
      local_58._M_string_length = sVar4;
      ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"named {} already exists",fmt_01,args_01);
      message_01._M_str = local_88._M_dataplus._M_p;
      message_01._M_len = local_88._M_string_length;
      RegistrationFailure::RegistrationFailure(pRVar5,message_01);
      __cxa_throw(pRVar5,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
  }
  return this_00;
}

Assistant:

FederateState* CommonCore::checkNewInterface(LocalFederateId federateID,
                                             std::string_view key,
                                             InterfaceType type)
{
    std::string_view tname = interfaceTypeName(type);
    if (type == InterfaceType::FILTER || type == InterfaceType::TRANSLATOR) {
        if (!waitCoreRegistration()) {
            if (getBrokerState() >= BrokerState::CONNECTED_ERROR) {
                throw(RegistrationFailure(
                    "core is terminated or in error state no further registration possible"));
            }
            throw(RegistrationFailure(
                fmt::format("registration timeout exceeded for register {}", tname)));
        }
    }

    FederateState* fed{nullptr};
    if (federateID != gLocalCoreId && type != InterfaceType::FILTER) {
        fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier(fmt::format("federateID not valid (register {})", tname)));
        }
    }

    if (disableDynamicSources && type != InterfaceType::INPUT) {
        if (fed != nullptr) {
            if (fed->getState() >= FederateStates::INITIALIZING &&
                !fed->getOptionFlag(HELICS_FLAG_OBSERVER)) {
                throw(RegistrationFailure(fmt::format(
                    "Source {} from {} not allowed after entering initializing mode ({})",
                    interfaceTypeName(type),
                    fed->getIdentifier(),
                    key)));
            }
        } else {
            if (getBrokerState() >= BrokerState::INITIALIZING) {
                throw(RegistrationFailure(
                    fmt::format("Source {} not allowed after entering initializing mode ({})",
                                interfaceTypeName(type),
                                key)));
            }
        }
    }
    if (!key.empty()) {
        const auto* info =
            handles.read([&key, type](auto& hand) { return hand.getInterfaceHandle(key, type); });
        if (info != nullptr) {  // this key is already found
            throw(RegistrationFailure(fmt::format("named {} already exists", tname)));
        }
    }
    return fed;
}